

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O3

void __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
pushPriority<helics::ActionMessage_const&>
          (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *this,
          ActionMessage *val)

{
  bool bVar1;
  unique_lock<std::mutex> pullLock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = (mutex_type *)(this + 0x28);
  LOCK();
  bVar1 = this[0x80] ==
          (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>)0x1;
  if (bVar1) {
    this[0x80] = (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>)
                 0x0;
  }
  UNLOCK();
  if (bVar1) {
    local_30._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_30);
    local_30._M_owns = true;
    LOCK();
    this[0x80] = (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>)
                 0x0;
    UNLOCK();
    CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
              ((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)(this + 0x88)
               ,val);
  }
  else {
    local_30._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_30);
    local_30._M_owns = true;
    CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
              ((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)(this + 0x88)
               ,val);
    LOCK();
    bVar1 = this[0x80] ==
            (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>)0x1;
    if (bVar1) {
      this[0x80] = (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>)
                   0x0;
    }
    UNLOCK();
    if (!bVar1) goto LAB_002dfbb1;
  }
  std::condition_variable::notify_all();
LAB_002dfbb1:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void pushPriority(Z&& val)  // forwarding reference
        {
            bool expEmpty = true;
            if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                std::unique_lock<MUTEX> pullLock(m_pullLock);  // first pullLock
                queueEmptyFlag = false;  // need to set the flag again just in
                                         // case after we get the lock
                priorityQueue.push(std::forward<Z>(val));
                // pullLock.unlock ();
                condition.notify_all();
            } else {
                std::unique_lock<MUTEX> pullLock(m_pullLock);
                priorityQueue.push(std::forward<Z>(val));
                expEmpty = true;
                if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                    condition.notify_all();
                }
            }
        }